

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O0

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
llvm::MemoryBuffer::getFileOrSTDIN
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename,int64_t FileSize,bool RequiresNullTerminator)

{
  bool local_209;
  char *local_1e0 [2];
  char *local_1d0;
  char *local_1c8;
  undefined1 local_1c0 [8];
  StringRef NameRef;
  SmallString<256U> NameBuf;
  bool RequiresNullTerminator_local;
  int64_t FileSize_local;
  Twine *Filename_local;
  char *local_60;
  char *local_58;
  char *local_50;
  char **local_48;
  char **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  SmallString<256U>::SmallString((SmallString<256U> *)&NameRef.Length);
  _local_1c0 = Twine::toStringRef(Filename,(SmallVectorImpl<char> *)&NameRef.Length);
  local_1d0 = (char *)local_1c0;
  local_1c8 = NameRef.Data;
  local_48 = local_1e0;
  local_50 = "-";
  local_1e0[0] = "-";
  local_30 = (char *)strlen("-");
  local_60 = local_1d0;
  local_58 = local_1c8;
  local_38 = local_1e0[0];
  local_40 = &local_60;
  local_209 = false;
  if (local_1c8 == local_30) {
    local_18 = local_1d0;
    local_20 = local_1e0[0];
    local_28 = local_30;
    if (local_30 == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_1d0,local_1e0[0],(size_t)local_30);
    }
    local_209 = local_c == 0;
  }
  if (local_209) {
    getSTDIN();
  }
  else {
    getFile(__return_storage_ptr__,Filename,FileSize,RequiresNullTerminator,false);
  }
  SmallString<256U>::~SmallString((SmallString<256U> *)&NameRef.Length);
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<std::unique_ptr<MemoryBuffer>>
MemoryBuffer::getFileOrSTDIN(const Twine &Filename, int64_t FileSize,
                             bool RequiresNullTerminator) {
  SmallString<256> NameBuf;
  StringRef NameRef = Filename.toStringRef(NameBuf);

  if (NameRef == "-")
    return getSTDIN();
  return getFile(Filename, FileSize, RequiresNullTerminator);
}